

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O3

deUint32 *
vk::BinaryRegistryDetail::BinaryIndexHashImpl_find(BinaryIndexHashImpl *hash,ProgramBinary *key)

{
  pointer puVar1;
  pointer puVar2;
  deUint32 dVar3;
  int iVar4;
  deBool dVar5;
  size_t sVar6;
  pointer cmp;
  pointer puVar7;
  long lVar8;
  deUint32 *pdVar9;
  BinaryIndexHashImplSlot *pBVar10;
  
  if (0 < hash->numElements) {
    puVar7 = (key->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar6 = (long)(key->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar7;
    if (sVar6 == 0) {
      puVar7 = (pointer)0x0;
    }
    dVar3 = deMemoryHash(puVar7,sVar6);
    pBVar10 = hash->slotTable[(int)(hash->slotTableSize - 1U & dVar3)];
    if (pBVar10 == (BinaryIndexHashImplSlot *)0x0) {
      return (deUint32 *)0x0;
    }
    do {
      iVar4 = pBVar10->numUsed;
      if (0 < iVar4) {
        pdVar9 = pBVar10->values;
        lVar8 = 0;
        do {
          puVar7 = (pBVar10->keys[lVar8]->m_binary).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar1 = (pBVar10->keys[lVar8]->m_binary).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          cmp = (key->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
          puVar2 = (key->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          sVar6 = (long)puVar1 - (long)puVar7;
          if (sVar6 == (long)puVar2 - (long)cmp) {
            if (puVar7 == puVar1) {
              puVar7 = (pointer)0x0;
            }
            if (cmp == puVar2) {
              cmp = (pointer)0x0;
            }
            dVar5 = deMemoryEqual(puVar7,cmp,sVar6);
            if (dVar5 != 0) {
              return pdVar9;
            }
            iVar4 = pBVar10->numUsed;
          }
          lVar8 = lVar8 + 1;
          pdVar9 = pdVar9 + 1;
        } while (lVar8 < iVar4);
      }
      pBVar10 = pBVar10->nextSlot;
    } while (pBVar10 != (BinaryIndexHashImplSlot *)0x0);
  }
  return (deUint32 *)0x0;
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}